

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O3

void __thiscall Debugger::DoLogMessage(Debugger *this,shared_ptr<BreakPoint> *bp)

{
  string *psVar1;
  ostream *poVar2;
  char cVar3;
  uint uVar4;
  undefined8 uVar5;
  pointer pLVar6;
  bool bVar7;
  int iVar8;
  Variable *pVVar9;
  size_type *psVar10;
  EmmyFacade *this_00;
  string *psVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  shared_ptr<BreakPoint> *psVar15;
  Idx<Variable> id;
  string baseName;
  size_t leftBraceBegin;
  size_t rightBraceBegin;
  vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_> replaceExpresses;
  stringstream message;
  undefined1 local_250 [32];
  EvalContext *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_> local_218;
  shared_ptr<BreakPoint> *local_1f8;
  shared_ptr<EvalContext> local_1f0;
  Debugger *local_1e0;
  bool local_1d8;
  undefined7 uStack_1d7;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  local_228._M_allocated_capacity =
       (size_type)(bp->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar1 = &((element_type *)local_228._M_allocated_capacity)->logMessage;
  iVar8 = 0;
  local_218.super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230 = (EvalContext *)0x0;
  local_228._8_8_ = (EvalContext *)0x0;
  local_250._0_8_ = (EvalContext *)0x0;
  local_1f8 = bp;
  local_1e0 = this;
  if ((((element_type *)local_228._M_allocated_capacity)->logMessage)._M_string_length != 0) {
    lVar13 = 0;
    do {
      cVar3 = *(char *)(local_250._0_8_ + (long)(psVar1->_M_dataplus)._M_p);
      if (iVar8 == 2) {
        if ((cVar3 == '}') &&
           ((EvalContext *)local_250._0_8_ == (EvalContext *)(local_228._8_8_ + 1))) {
          local_1b8[0] = (stringstream)0x0;
          std::vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>>::
          emplace_back<char_const(&)[2],unsigned_long&,unsigned_long&,bool>
                    ((vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>> *)
                     &local_218,(char (*) [2])0x163ef7,(unsigned_long *)(local_228._M_local_buf + 8)
                     ,(unsigned_long *)local_250,(bool *)local_1b8);
        }
        else {
          local_250._0_8_ = local_250._0_8_ + -1;
        }
LAB_00147abc:
        iVar8 = 0;
      }
      else if (iVar8 == 1) {
        iVar8 = 1;
        if (cVar3 == '}') {
          if (lVar13 == 0) {
            std::__cxx11::string::substr((ulong)local_1b8,(ulong)psVar1);
            local_1d8 = true;
            std::vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>>::
            emplace_back<std::__cxx11::string,unsigned_long&,unsigned_long&,bool>
                      ((vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>> *)
                       &local_218,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,(unsigned_long *)&local_230,(unsigned_long *)local_250,&local_1d8);
            if ((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1b8 + 0x10) {
              operator_delete((undefined1 *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
            }
            lVar13 = 0;
            goto LAB_00147abc;
          }
          lVar13 = lVar13 + -1;
        }
        else if (cVar3 == '{') {
          if ((EvalContext *)local_250._0_8_ ==
              (EvalContext *)((long)&(local_230->super_JsonProtocol)._vptr_JsonProtocol + 1)) {
            local_1b8[0] = (stringstream)0x0;
            std::vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>>::
            emplace_back<char_const(&)[2],unsigned_long&,unsigned_long&,bool>
                      ((vector<LogMessageReplaceExpress,std::allocator<LogMessageReplaceExpress>> *)
                       &local_218,(char (*) [2])"{",(unsigned_long *)&local_230,
                       (unsigned_long *)local_250,(bool *)local_1b8);
            goto LAB_00147abc;
          }
          lVar13 = lVar13 + 1;
        }
      }
      else if (cVar3 == '}') {
        iVar8 = 2;
        local_228._8_8_ = local_250._0_8_;
      }
      else {
        iVar8 = 0;
        if (cVar3 == '{') {
          iVar8 = 1;
          lVar13 = 0;
          local_230 = (EvalContext *)local_250._0_8_;
        }
      }
      local_250._0_8_ = local_250._0_8_ + 1;
    } while ((EvalContext *)local_250._0_8_ !=
             *(EvalContext **)(local_228._M_allocated_capacity + 0x70));
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar2 = (ostream *)(local_1b8 + 0x10);
  if (local_218.
      super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_218.
      super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,(((string *)(local_228._M_allocated_capacity + 0x68))->_M_dataplus)._M_p,
               *(size_type *)(local_228._M_allocated_capacity + 0x70));
    psVar15 = local_1f8;
  }
  else {
    lVar13 = 0;
    lVar14 = 0;
    uVar12 = 0;
    do {
      pLVar6 = local_218.
               super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar12 < *(ulong *)((long)&(local_218.
                                      super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->StartIndex +
                             lVar13)) {
        std::__cxx11::string::substr((ulong)local_250,(ulong)psVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,(char *)local_250._0_8_,local_250._8_8_);
        if ((EvalContext *)local_250._0_8_ != (EvalContext *)(local_250 + 0x10)) {
          operator_delete((void *)local_250._0_8_);
        }
      }
      if ((&pLVar6->NeedEval)[lVar13] == true) {
        local_250._0_8_ = (EvalContext *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<EvalContext,std::allocator<EvalContext>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8),
                   (EvalContext **)local_250,(allocator<EvalContext> *)&local_1d8);
        std::__cxx11::string::operator=
                  ((string *)(local_250._0_8_ + 8),
                   (string *)((long)&(pLVar6->Expr)._M_dataplus._M_p + lVar13));
        *(int *)(local_250._0_8_ + 0x70) = 1;
        local_1f0.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_250._0_8_;
        local_1f0.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)(local_250._8_8_ + 8) = *(_Atomic_word *)(local_250._8_8_ + 8) + 1;
          }
        }
        bVar7 = DoEval(local_1e0,&local_1f0);
        if (local_1f0.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1f0.super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bVar7) {
          id._4_4_ = 0;
          id.Raw = ((Idx<Variable> *)(local_250._0_8_ + 0x78))->Raw;
          id._arena = *(ArenaClass **)(local_250._0_8_ + 0x80);
          pVVar9 = Arena<Variable>::Index(*(ArenaClass **)(local_250._0_8_ + 0x80),id);
          psVar11 = &pVVar9->value;
          psVar10 = &(pVVar9->value)._M_string_length;
        }
        else {
          psVar11 = (string *)(local_250._0_8_ + 0x48);
          psVar10 = (size_type *)(local_250._0_8_ + 0x50);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,(psVar11->_M_dataplus)._M_p,*psVar10);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,*(char **)((long)&(pLVar6->Expr)._M_dataplus._M_p + lVar13),
                   *(long *)((long)&(pLVar6->Expr)._M_string_length + lVar13));
      }
      psVar15 = local_1f8;
      uVar12 = *(long *)((long)&pLVar6->EndIndex + lVar13) + 1;
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0x38;
    } while (lVar14 != ((long)local_218.
                              super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_218.
                              super__Vector_base<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
    if (uVar12 < *(size_type *)(local_228._M_allocated_capacity + 0x70)) {
      std::__cxx11::string::substr((ulong)local_250,(ulong)psVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),(char *)local_250._0_8_,local_250._8_8_);
      if ((EvalContext *)local_250._0_8_ != (EvalContext *)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_);
      }
    }
  }
  BaseName((string *)local_250,
           &((psVar15->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->file);
  this_00 = EmmyFacade::Get();
  uVar5 = local_250._0_8_;
  uVar4 = ((psVar15->super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->line;
  std::__cxx11::stringbuf::str();
  EmmyFacade::SendLog(this_00,Info,"[%s:%d] %s",uVar5,(ulong)uVar4,CONCAT71(uStack_1d7,local_1d8));
  if ((undefined1 *)CONCAT71(uStack_1d7,local_1d8) != local_1c8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1d7,local_1d8));
  }
  if ((EvalContext *)local_250._0_8_ != (EvalContext *)(local_250 + 0x10)) {
    operator_delete((void *)local_250._0_8_);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  std::vector<LogMessageReplaceExpress,_std::allocator<LogMessageReplaceExpress>_>::~vector
            (&local_218);
  return;
}

Assistant:

void Debugger::DoLogMessage(std::shared_ptr<BreakPoint> bp) {
	std::string &logMessage = bp->logMessage;
	// 为什么不用regex?
	// 因为gcc 4.8 regex还是空实现
	// 而且后续版本的gcc中正则表达式行为似乎也不太正常
	enum class ParseState {
		Normal,
		LeftBrace,
		RightBrace
	} state = ParseState::Normal;

	std::vector<LogMessageReplaceExpress> replaceExpresses;


	std::size_t leftBraceBegin = 0;

	std::size_t rightBraceBegin = 0;

	// 如果在表达式中出现左大括号
	std::size_t exprLeftCount = 0;


	for (std::size_t index = 0; index != logMessage.size(); index++) {
		char ch = logMessage[index];

		switch (state) {
			case ParseState::Normal: {
				if (ch == '{') {
					state = ParseState::LeftBrace;
					leftBraceBegin = index;
					exprLeftCount = 0;
				} else if (ch == '}') {
					state = ParseState::RightBrace;
					rightBraceBegin = index;
				}
				break;
			}
			case ParseState::LeftBrace: {
				if (ch == '{') {
					// 认为是左双大括号转义为可见的'{'
					if (index == leftBraceBegin + 1) {
						replaceExpresses.emplace_back("{", leftBraceBegin, index, false);
						state = ParseState::Normal;
					} else {
						exprLeftCount++;
					}
				} else if (ch == '}') {
					// 认为是表达式内的大括号
					if (exprLeftCount > 0) {
						exprLeftCount--;
						continue;
					}

					replaceExpresses.emplace_back(logMessage.substr(leftBraceBegin + 1, index - leftBraceBegin - 1),
					                              leftBraceBegin, index, true);


					state = ParseState::Normal;
				}
				break;
			}
			case ParseState::RightBrace: {
				if (ch == '}' && (index == rightBraceBegin + 1)) {
					replaceExpresses.emplace_back("}", rightBraceBegin, index, false);
				} else {
					//认为左右大括号失配，之前的不做处理，退格一位回去重新判断
					index--;
				}
				state = ParseState::Normal;
				break;
			}
		}
	}

	std::stringstream message;

	if (replaceExpresses.empty()) {
		message << logMessage;
	} else {
		// 拼接字符串
		// 怎么replace 函数都没有啊

		std::size_t start = 0;
		for (std::size_t index = 0; index != replaceExpresses.size(); index++) {
			auto &replaceExpress = replaceExpresses[index];
			if (start < replaceExpress.StartIndex) {
				auto fragment = logMessage.substr(start, replaceExpress.StartIndex - start);
				message << fragment;
				start = replaceExpress.StartIndex;
			}

			if (replaceExpress.NeedEval) {
				auto ctx = std::make_shared<EvalContext>();
				ctx->expr = std::move(replaceExpress.Expr);
				ctx->depth = 1;
				bool succeed = DoEval(ctx);
				if (succeed) {
					message << ctx->result->value;
				} else {
					message << ctx->error;
				}
			} else {
				message << replaceExpress.Expr;
			}

			start = replaceExpress.EndIndex + 1;
		}

		if (start < logMessage.size()) {
			auto fragment = logMessage.substr(start, logMessage.size() - start);
			message << fragment;
		}
	}

	std::string baseName = BaseName(bp->file);

	EmmyFacade::Get().SendLog(LogType::Info, "[%s:%d] %s", baseName.c_str(), bp->line, message.str().c_str());
}